

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O3

int __thiscall Fl_Menu_::add(Fl_Menu_ *this,char *str)

{
  char cVar1;
  uint shortcut;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char buf [1024];
  char local_428 [1024];
  
  if (*str == '\0') {
    return 0;
  }
  lVar4 = 0;
  shortcut = 0;
LAB_001c10d9:
  do {
    pcVar3 = local_428 + lVar4;
    cVar1 = *str;
    if ((cVar1 != '\0') && (cVar1 != '|')) {
      if (cVar1 == '\t') {
        *pcVar3 = '\0';
        shortcut = fl_old_shortcut(str);
      }
      else {
        *pcVar3 = cVar1;
      }
      lVar4 = lVar4 + 1;
      str = str + 1;
      pcVar3 = local_428 + 0x3fe;
      if (lVar4 != 0x3fe) goto LAB_001c10d9;
    }
    *pcVar3 = '\0';
    lVar4 = 0;
    iVar2 = insert(this,-1,local_428,shortcut,(Fl_Callback *)0x0,(void *)0x0,0);
    str = str + (*str != '\0');
    shortcut = 0;
    if (*str == '\0') {
      return iVar2;
    }
  } while( true );
}

Assistant:

int Fl_Menu_::add(const char *str) {
  char buf[1024];
  int r = 0;
  while (*str) {
    int sc = 0;
    char *c;
    for (c = buf; c < (buf + sizeof(buf) - 2) && *str && *str != '|'; str++) {
      if (*str == '\t') {*c++ = 0; sc = fl_old_shortcut(str);}
      else *c++ = *str;
    }
    *c = 0;
    r = add(buf, sc, 0, 0, 0);
    if (*str) str++;
  }
  return r;
}